

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::IsIntScalar
               (ValidationState_t *_,uint32_t id,bool must_len32,bool must_unsigned)

{
  Op OVar1;
  uint uVar2;
  Instruction *this;
  bool local_29;
  Instruction *type;
  bool must_unsigned_local;
  bool must_len32_local;
  uint32_t id_local;
  ValidationState_t *__local;
  
  this = ValidationState_t::FindDef(_,id);
  if ((this == (Instruction *)0x0) || (OVar1 = val::Instruction::opcode(this), OVar1 != OpTypeInt))
  {
    return false;
  }
  if ((must_len32) && (uVar2 = val::Instruction::GetOperandAs<unsigned_int>(this,1), uVar2 != 0x20))
  {
    return false;
  }
  local_29 = true;
  if (must_unsigned) {
    uVar2 = val::Instruction::GetOperandAs<unsigned_int>(this,2);
    local_29 = uVar2 == 0;
  }
  return local_29;
}

Assistant:

bool IsIntScalar(ValidationState_t& _, uint32_t id, bool must_len32,
                 bool must_unsigned) {
  auto type = _.FindDef(id);
  if (!type || type->opcode() != spv::Op::OpTypeInt) {
    return false;
  }

  if (must_len32 && type->GetOperandAs<uint32_t>(1) != 32) {
    return false;
  }

  return !must_unsigned || type->GetOperandAs<uint32_t>(2) == 0;
}